

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

partial_ordering __thiscall phosg::JSON::operator<=>(JSON *this,list_type *v)

{
  ulong uVar1;
  partial_ordering pVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  JSON *pJVar6;
  ulong uVar7;
  bool bVar8;
  
  bVar8 = *(__index_type *)
           ((long)&(this->value).
                   super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                   .
                   super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                   .
                   super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                   .
                   super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                   .
                   super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                   .
                   super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
           + 0x38) == '\x05';
  pJVar6 = (JSON *)0x0;
  if (bVar8) {
    pJVar6 = this;
  }
  bVar5 = 2;
  if (bVar8) {
    uVar3 = *(long *)((long)&(pJVar6->value).
                             super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                             .
                             super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                             .
                             super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                             .
                             super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                             .
                             super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                             .
                             super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                     + 8) -
            *(long *)&(pJVar6->value).
                      super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                      .
                      super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                      .
                      super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                      .
                      super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                      .
                      super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                      .
                      super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
            >> 3;
    uVar7 = (long)(v->
                  super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(v->
                  super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar3 <= uVar7) {
      uVar7 = uVar3;
    }
    bVar8 = uVar7 != 0;
    if (bVar8) {
      pVar2 = operator<=>((JSON *)**(undefined8 **)
                                    &(pJVar6->value).
                                     super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                                     .
                                     super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                     .
                                     super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                     .
                                     super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                     .
                                     super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                     .
                                     super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                          ,(JSON *)(((v->
                                     super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<phosg::JSON,_std::default_delete<phosg::JSON>_>
                                   ._M_t);
      uVar3 = (ulong)(byte)pVar2._M_value;
      if (pVar2._M_value == '\0') {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          if (uVar7 == uVar4) break;
          pVar2 = operator<=>(*(JSON **)(*(long *)&(pJVar6->value).
                                                                                                      
                                                  super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                                                  .
                                                  super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                                  .
                                                  super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                                  .
                                                  super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                                  .
                                                  super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                                  .
                                                  super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                        + uVar4 * 8),
                              (JSON *)(v->
                                      super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
                                      super___uniq_ptr_impl<phosg::JSON,_std::default_delete<phosg::JSON>_>
                                      ._M_t);
          uVar3 = (ulong)(byte)pVar2._M_value;
          uVar1 = uVar4 + 1;
        } while (pVar2._M_value == '\0');
        bVar8 = uVar4 < uVar7;
      }
    }
    bVar5 = (byte)uVar3;
    if ((!bVar8) &&
       (uVar7 = *(long *)((long)&(pJVar6->value).
                                 super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                                 .
                                 super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                 .
                                 super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                 .
                                 super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                 .
                                 super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                                 .
                                 super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                         + 8) -
                *(long *)&(pJVar6->value).
                          super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                          .
                          super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                          .
                          super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                          .
                          super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                          .
                          super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                          .
                          super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                >> 3,
       uVar3 = (long)(v->
                     super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(v->
                     super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3, bVar5 = -(uVar7 < uVar3) | 1,
       uVar7 == uVar3)) {
      bVar5 = 0;
    }
  }
  return (partial_ordering)bVar5;
}

Assistant:

partial_ordering JSON::operator<=>(const list_type& v) const {
  const list_type* stored_v = get_if<5>(&this->value);
  if (stored_v == nullptr) {
    return partial_ordering::unordered;
  }
  // Note: We don't use vector::operator<=> here because the items are pointers,
  // and we want to compare the pointed-to objects instead.
  size_t max_size = min<size_t>(stored_v->size(), v.size());
  for (size_t z = 0; z < max_size; z++) {
    partial_ordering item_ret = *(*stored_v)[z] <=> *v[z];
    if (item_ret != 0) {
      return item_ret;
    }
  }
  // If we get here, then all possible items matched. If the sizes aren't equal
  // and stored_v is longer, then stored_v is greater than v; if v is longer,
  // then v is greater than stored_v.
  return stored_v->size() <=> v.size();
}